

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool.cpp
# Opt level: O3

int runCommand(string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,path *keyFile)

{
  int iVar1;
  const_iterator cVar2;
  runtime_error *prVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  allocator_type local_e2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e1;
  int local_e0 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_58;
  
  if (runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
      ::commandArgs_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
                                 ::commandArgs_abi_cxx11_);
    if (iVar1 != 0) {
      local_e0[3] = 0;
      beast::unit_test::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::pair<const_char_(&)[12],_int,_true>(&local_d0,(char (*) [12])"create_keys",local_e0 + 3);
      local_e0[2] = 0;
      beast::unit_test::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::pair<const_char_(&)[13],_int,_true>(&local_a8,(char (*) [13])"create_token",local_e0 + 2);
      local_e0[1] = 0;
      beast::unit_test::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::pair<const_char_(&)[12],_int,_true>(&local_80,(char (*) [12])"revoke_keys",local_e0 + 1);
      local_e0[0] = 1;
      beast::unit_test::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::pair<const_char_(&)[5],_int,_true>(&local_58,(char (*) [5])0x274acf,local_e0);
      __l._M_len = 4;
      __l._M_array = &local_d0;
      beast::unit_test::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::map(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
             ::commandArgs_abi_cxx11_,__l,&local_e1,&local_e2);
      lVar4 = -0xa0;
      paVar5 = &local_58.first.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(beast::unit_test::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::~map,&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
                           ::commandArgs_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
                           ::commandArgs_abi_cxx11_);
    }
  }
  cVar2 = beast::unit_test::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
                  ::commandArgs_abi_cxx11_._M_t,command);
  if ((_Rb_tree_header *)cVar2._M_node !=
      &runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
       ::commandArgs_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5 == *(long *)(cVar2._M_node + 2)) {
      iVar1 = std::__cxx11::string::compare((char *)command);
      if (iVar1 == 0) {
        createKeyFile(keyFile);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)command);
        if (iVar1 == 0) {
          createToken(keyFile);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)command);
          if (iVar1 == 0) {
            createRevocation(keyFile);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)command);
            if (iVar1 == 0) {
              signData((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,keyFile);
            }
          }
        }
      }
      return 0;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Syntax error: Wrong number of arguments");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                 "Unknown command: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)command);
  std::runtime_error::runtime_error(prVar3,(string *)&local_d0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int runCommand (std::string const& command,
    std::vector <std::string> const& args,
    boost::filesystem::path const& keyFile)
{
    using namespace std;

    static map<string, vector<string>::size_type> const commandArgs = {
        { "create_keys", 0 },
        { "create_token", 0 },
        { "revoke_keys", 0 },
        { "sign", 1 }};

    auto const iArgs = commandArgs.find (command);

    if (iArgs == commandArgs.end ())
        throw std::runtime_error ("Unknown command: " + command);

    if (args.size() != iArgs->second)
        throw std::runtime_error ("Syntax error: Wrong number of arguments");

    if (command == "create_keys")
        createKeyFile (keyFile);
    else if (command == "create_token")
        createToken (keyFile);
    else if (command == "revoke_keys")
        createRevocation (keyFile);
    else if (command == "sign")
        signData (args[0], keyFile);

    return 0;
}